

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O3

void __thiscall Assimp::DeboneProcess::UpdateNode(DeboneProcess *this,aiNode *pNode)

{
  pointer pvVar1;
  long lVar2;
  iterator iVar3;
  uint uVar4;
  ulong uVar5;
  uint *__dest;
  uint *puVar6;
  ulong uVar7;
  long lVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newMeshList;
  uint *local_68;
  iterator iStack_60;
  uint *local_58;
  ulong local_48;
  DeboneProcess *local_40;
  long local_38;
  
  local_68 = (uint *)0x0;
  iStack_60._M_current = (uint *)0x0;
  local_58 = (uint *)0x0;
  local_48 = (ulong)pNode->mNumMeshes;
  local_38 = (long)(this->mSubMeshIndices).
                   super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mSubMeshIndices).
                   super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_40 = this;
  if (local_48 != 0) {
    uVar7 = 0;
    do {
      uVar4 = pNode->mMeshes[uVar7];
      pvVar1 = (local_40->mSubMeshIndices).
               super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)*(pointer *)
                     ((long)&pvVar1[uVar4].
                             super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              *(long *)&pvVar1[uVar4].
                        super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                        ._M_impl.super__Vector_impl_data;
      if ((uVar5 & 0xffffffff0) != 0) {
        uVar5 = uVar5 >> 4 & 0xffffffff;
        lVar8 = 0;
        do {
          lVar2 = *(long *)&pvVar1[uVar4].
                            super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                            ._M_impl.super__Vector_impl_data;
          if (*(long *)(lVar2 + 8 + lVar8) == 0) {
            puVar6 = (uint *)(lVar2 + lVar8);
            if (iStack_60._M_current == local_58) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                         puVar6);
            }
            else {
              *iStack_60._M_current = *puVar6;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
          }
          lVar8 = lVar8 + 0x10;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_48);
  }
  uVar7 = (local_38 >> 3) * -0x5555555555555555;
  if ((int)uVar7 != 0) {
    local_48 = uVar7 & 0xffffffff;
    uVar7 = 0;
    do {
      pvVar1 = (local_40->mSubMeshIndices).
               super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)*(pointer *)
                     ((long)&pvVar1[uVar7].
                             super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              *(long *)&pvVar1[uVar7].
                        super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                        ._M_impl.super__Vector_impl_data;
      if ((uVar5 & 0xffffffff0) != 0) {
        uVar5 = uVar5 >> 4 & 0xffffffff;
        lVar8 = 0;
        do {
          lVar2 = *(long *)&pvVar1[uVar7].
                            super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                            ._M_impl.super__Vector_impl_data;
          if (*(aiNode **)(lVar2 + 8 + lVar8) == pNode) {
            puVar6 = (uint *)(lVar2 + lVar8);
            if (iStack_60._M_current == local_58) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                         puVar6);
            }
            else {
              *iStack_60._M_current = *puVar6;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
          }
          lVar8 = lVar8 + 0x10;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_48);
  }
  if (pNode->mNumMeshes != 0) {
    if (pNode->mMeshes != (uint *)0x0) {
      operator_delete__(pNode->mMeshes);
    }
    pNode->mMeshes = (uint *)0x0;
  }
  iVar3._M_current = iStack_60._M_current;
  puVar6 = local_68;
  uVar7 = (long)iStack_60._M_current - (long)local_68;
  uVar4 = (uint)(uVar7 >> 2);
  pNode->mNumMeshes = uVar4;
  if (uVar4 != 0) {
    __dest = (uint *)operator_new__(uVar7 & 0x3fffffffc);
    pNode->mMeshes = __dest;
    if (iVar3._M_current != puVar6) {
      memmove(__dest,puVar6,uVar7);
    }
  }
  if (pNode->mNumChildren != 0) {
    uVar7 = 0;
    do {
      UpdateNode(local_40,pNode->mChildren[uVar7]);
      uVar7 = uVar7 + 1;
      puVar6 = local_68;
    } while (uVar7 < pNode->mNumChildren);
  }
  if (puVar6 != (uint *)0x0) {
    operator_delete(puVar6);
  }
  return;
}

Assistant:

void DeboneProcess::UpdateNode(aiNode* pNode) const
{
    // rebuild the node's mesh index list

    std::vector<unsigned int> newMeshList;

    // this will require two passes

    unsigned int m = static_cast<unsigned int>(pNode->mNumMeshes), n = static_cast<unsigned int>(mSubMeshIndices.size());

    // first pass, look for meshes which have not moved

    for(unsigned int a=0;a<m;a++)   {

        unsigned int srcIndex = pNode->mMeshes[a];
        const std::vector< std::pair< unsigned int,aiNode* > > &subMeshes = mSubMeshIndices[srcIndex];
        unsigned int nSubmeshes = static_cast<unsigned int>(subMeshes.size());

        for(unsigned int b=0;b<nSubmeshes;b++) {
            if(!subMeshes[b].second) {
                newMeshList.push_back(subMeshes[b].first);
            }
        }
    }

    // second pass, collect deboned meshes

    for(unsigned int a=0;a<n;a++)
    {
        const std::vector< std::pair< unsigned int,aiNode* > > &subMeshes = mSubMeshIndices[a];
        unsigned int nSubmeshes = static_cast<unsigned int>(subMeshes.size());

        for(unsigned int b=0;b<nSubmeshes;b++) {
            if(subMeshes[b].second == pNode)    {
                newMeshList.push_back(subMeshes[b].first);
            }
        }
    }

    if( pNode->mNumMeshes > 0 ) {
        delete [] pNode->mMeshes; pNode->mMeshes = NULL;
    }

    pNode->mNumMeshes = static_cast<unsigned int>(newMeshList.size());

    if(pNode->mNumMeshes)   {
        pNode->mMeshes = new unsigned int[pNode->mNumMeshes];
        std::copy( newMeshList.begin(), newMeshList.end(), pNode->mMeshes);
    }

    // do that also recursively for all children
    for( unsigned int a = 0; a < pNode->mNumChildren; ++a ) {
        UpdateNode( pNode->mChildren[a]);
    }
}